

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

arrayMoveList * __thiscall
game::generateLegalMoves(arrayMoveList *__return_storage_ptr__,game *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  move mVar5;
  move moveMade;
  long lVar6;
  game *pgVar7;
  U64 *pUVar8;
  byte bVar9;
  bitboards in_stack_fffffffffffffc58;
  arrayMoveList moves;
  
  bVar9 = 0;
  generateSemilegalMoves(&moves,this);
  memset(__return_storage_ptr__,0,0x304);
  __return_storage_ptr__->iteratorCount = -1;
  arrayMoveList::resetIterator(&moves);
  do {
    do {
      while( true ) {
        while( true ) {
          bVar1 = arrayMoveList::next(&moves);
          if (!bVar1) {
            return __return_storage_ptr__;
          }
          mVar5 = arrayMoveList::getMove(&moves);
          moveMade = arrayMoveList::getMove(&moves);
          makeMove(this,moveMade);
          bVar1 = isGameLegal(this);
          if (((uint3)mVar5 & 0xff0000) == 0x10000) break;
          if (bVar1) {
            mVar5 = arrayMoveList::getMove(&moves);
            arrayMoveList::add(__return_storage_ptr__,mVar5);
          }
          undoMove(this);
        }
        undoMove(this);
        bVar2 = this->blacksTurn;
        pgVar7 = this;
        pUVar8 = (U64 *)&stack0xfffffffffffffc58;
        for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
          *pUVar8 = (pgVar7->boards).WP;
          pgVar7 = (game *)((long)pgVar7 + (ulong)bVar9 * -0x10 + 8);
          pUVar8 = pUVar8 + (ulong)bVar9 * -2 + 1;
        }
        bVar2 = inCheck(bVar2,in_stack_fffffffffffffc58);
        mVar5 = arrayMoveList::getMove(&moves);
        if (mVar5.end == '>') break;
        uVar4 = mVar5._1_2_ & 0xff;
        if (uVar4 == 6) {
          mVar5 = arrayMoveList::getMove(&moves);
          mVar5 = (move)((uint3)mVar5 & 0xff | 0x500);
          goto LAB_00103988;
        }
        if (uVar4 == 0x3a) {
          mVar5 = arrayMoveList::getMove(&moves);
          mVar5 = (move)((uint3)mVar5 & 0xff | 0x3b00);
          goto LAB_00103988;
        }
        if (uVar4 == 2) {
          mVar5 = arrayMoveList::getMove(&moves);
          mVar5 = (move)((uint3)mVar5 & 0xff | 0x300);
          goto LAB_00103988;
        }
        if (bVar1 && !bVar2) goto LAB_001039ac;
      }
      mVar5 = arrayMoveList::getMove(&moves);
      mVar5 = (move)((uint3)mVar5 & 0xff | 0x3d00);
LAB_00103988:
      makeMove(this,mVar5);
      bVar3 = isGameLegal(this);
      undoMove(this);
    } while ((!bVar1 || bVar2) || !bVar3);
LAB_001039ac:
    mVar5 = arrayMoveList::getMove(&moves);
    arrayMoveList::add(__return_storage_ptr__,mVar5);
  } while( true );
}

Assistant:

arrayMoveList game::generateLegalMoves() {
    arrayMoveList moves = generateSemilegalMoves();
    arrayMoveList returnedMoves;

    moves.resetIterator();
    while(moves.next()) {
        if(moves.getMove().special == 1) { // Are castling kings put in check en route?
            bool good = true;
            makeMove(moves.getMove());
            if(!isGameLegal()) good = false;
            undoMove();

            if(inCheck(blacksTurn, boards)) good = false;

            move intermediate;
            switch (moves.getMove().end) {
                case 2:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 3;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 6:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 5;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 58:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 59;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 62:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 61;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
            }
            if(good) returnedMoves.add(moves.getMove());
        } else {
            makeMove(moves.getMove());
            if(isGameLegal()) returnedMoves.add(moves.getMove());
            undoMove();
        }
    }
    return returnedMoves;
}